

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.h
# Opt level: O1

_Bool is_conid_start_char(int32_t c)

{
  uint8_t *puVar1;
  ulong uVar2;
  
  if (c < 0x41) {
    return false;
  }
  if (c < 0x2cf3) {
    c = c - 0x41;
    uVar2 = (ulong)((uint)c >> 3);
    puVar1 = bitmap_conid_start_1;
  }
  else {
    if (c < 0xa640) {
      return false;
    }
    if (c < 0xa7f6) {
      uVar2 = (ulong)(c - 0xa640U >> 3);
      puVar1 = "UUUUU\x15";
    }
    else {
      if (c < 0xff21) {
        return false;
      }
      if (c < 0x118c0) {
        c = c - 0xff21;
        uVar2 = (ulong)((uint)c >> 3);
        puVar1 = bitmap_conid_start_3;
      }
      else {
        if (c < 0x16e40) {
          return false;
        }
        if (c < 0x16e60) {
          uVar2 = (ulong)(c - 0x16e40U >> 3);
          puVar1 = bitmap_conid_start_4;
        }
        else {
          if (0x1521 < c - 0x1d400U) {
            return false;
          }
          uVar2 = (ulong)(c - 0x1d400U >> 3);
          puVar1 = bitmap_conid_start_5;
        }
      }
    }
  }
  return (puVar1[uVar2] >> (c & 7U) & 1) != 0;
}

Assistant:

static bool is_conid_start_char(int32_t c) {
  return
    c < bitmap_conid_start_1_min_codepoint ? false :
    c <= bitmap_conid_start_1_max_codepoint ? is_conid_start_1_char(c) :
    c < bitmap_conid_start_2_min_codepoint ? false :
    c <= bitmap_conid_start_2_max_codepoint ? is_conid_start_2_char(c) :
    c < bitmap_conid_start_3_min_codepoint ? false :
    c <= bitmap_conid_start_3_max_codepoint ? is_conid_start_3_char(c) :
    c < bitmap_conid_start_4_min_codepoint ? false :
    c <= bitmap_conid_start_4_max_codepoint ? is_conid_start_4_char(c) :
    c < bitmap_conid_start_5_min_codepoint ? false :
    c <= bitmap_conid_start_5_max_codepoint ? is_conid_start_5_char(c) :
    false;
}